

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

bool Js::VarIsImpl<Js::TypedArray<unsigned_char,false,false>>(RecyclableObject *obj)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  bool local_22;
  bool local_21;
  RecyclableObject *obj_local;
  TypeId typeId;
  
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  TVar3 = RecyclableObject::GetTypeId(obj);
  if (0x57 < (int)TVar3) {
    BVar4 = RecyclableObject::IsExternal(obj);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  local_21 = false;
  if (TVar3 == TypeIds_Uint8Array) {
    bVar2 = VirtualTableInfo<Js::TypedArray<unsigned_char,_false,_false>_>::HasVirtualTable(obj);
    local_22 = true;
    if (!bVar2) {
      local_22 = VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_char,_false,_false>_>_>
                 ::HasVirtualTable(obj);
    }
    local_21 = local_22;
  }
  return local_21;
}

Assistant:

bool VarIsImpl<Uint8Array>(RecyclableObject* obj)
    {
        return JavascriptOperators::GetTypeId(obj) == TypeIds_Uint8Array &&
              ( VirtualTableInfo<Uint8Array>::HasVirtualTable(obj) ||
                VirtualTableInfo<CrossSiteObject<Uint8Array>>::HasVirtualTable(obj)
              );
    }